

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O1

type * __thiscall
jsoncons::
json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
::as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (type *__return_storage_ptr__,
          json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
          *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j)

{
  bool bVar1;
  size_t __n;
  conv_error *this_00;
  iterator this_01;
  const_array_range_type cVar2;
  error_code ec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  error_code local_40;
  
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  if (bVar1) {
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __n = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(__return_storage_ptr__,__n);
    cVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    this_01 = cVar2.first_._M_current;
    if (this_01._M_current != cVar2.last_._M_current._M_current) {
      do {
        basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
        as_string<std::allocator<char>>
                  (&local_60,
                   (basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *)
                   this_01._M_current,&local_61);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        this_01._M_current = this_01._M_current + 0x10;
      } while (this_01._M_current != cVar2.last_._M_current._M_current);
    }
    return __return_storage_ptr__;
  }
  this_00 = (conv_error *)__cxa_allocate_exception(0x58);
  std::error_code::error_code<jsoncons::conv_errc,void>(&local_40,not_vector);
  ec._4_4_ = 0;
  ec._M_value = local_40._M_value;
  ec._M_cat = local_40._M_cat;
  conv_error::conv_error(this_00,ec);
  __cxa_throw(this_00,&conv_error::typeinfo,conv_error::~conv_error);
}

Assistant:

static typename std::enable_if<!ext_traits::is_byte<typename Container::value_type>::value,Container>::type
        as(const Json& j)
        {
            if (j.is_array())
            {
                T result;
                visit_reserve_(typename std::integral_constant<bool, ext_traits::has_reserve<T>::value>::type(),result,j.size());
                for (const auto& item : j.array_range())
                {
                    result.push_back(item.template as<value_type>());
                }

                return result;
            }
            else 
            {
                JSONCONS_THROW(conv_error(conv_errc::not_vector));
            }
        }